

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_adaptcontroller.c
# Opt level: O0

SUNErrCode SUNAdaptController_Space(SUNAdaptController C,long *lenrw,long *leniw)

{
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  long in_RDI;
  SUNContext_conflict sunctx_local_scope_;
  SUNErrCode ier;
  undefined4 local_24;
  undefined4 local_4;
  
  local_24 = 0;
  if (in_RDI == 0) {
    local_4 = -9999;
  }
  else {
    *in_RSI = 0;
    *in_RDX = 0;
    if (*(long *)(*(long *)(in_RDI + 8) + 0x40) != 0) {
      local_24 = (**(code **)(*(long *)(in_RDI + 8) + 0x40))(in_RDI,in_RSI,in_RDX);
    }
    local_4 = local_24;
  }
  return local_4;
}

Assistant:

SUNErrCode SUNAdaptController_Space(SUNAdaptController C, long int* lenrw,
                                    long int* leniw)
{
  SUNErrCode ier = SUN_SUCCESS;
  if (C == NULL) { return SUN_ERR_ARG_CORRUPT; }
  SUNFunctionBegin(C->sunctx);
  SUNAssert(lenrw, SUN_ERR_ARG_CORRUPT);
  SUNAssert(leniw, SUN_ERR_ARG_CORRUPT);
  *lenrw = 0; /* initialize outputs with identity */
  *leniw = 0;
  if (C->ops->space) { ier = C->ops->space(C, lenrw, leniw); }
  return (ier);
}